

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  rar_br *br;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  undefined8 uVar13;
  long lVar14;
  ulong uVar15;
  char *fmt;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  void *__dest;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  
LAB_00131ce0:
  pvVar4 = a->format->data;
  p = (CPpmd7 *)((long)pvVar4 + 0x370);
  rc = (IPpmd7_RangeDec *)((long)pvVar4 + 0x4e60);
  uVar20 = 0;
  do {
    if (*(char *)((long)pvVar4 + 200) == '\0') {
LAB_00132988:
      uVar20 = 0xffffffe2;
      goto LAB_00132a74;
    }
    if ((*(char *)((long)pvVar4 + 0x36a) != '\0') ||
       ((*(int *)((long)pvVar4 + 0xe0) != 0 &&
        (*(long *)((long)pvVar4 + 0x28) <= *(long *)((long)pvVar4 + 0xb0))))) {
      uVar6 = *(uint *)((long)pvVar4 + 0xcc);
      if ((ulong)uVar6 != 0) {
        pvVar12 = *(void **)((long)pvVar4 + 0xd8);
        *buff = pvVar12;
        *size = (ulong)uVar6;
        *offset = *(int64_t *)((long)pvVar4 + 0xb8);
        *(long *)((long)pvVar4 + 0xb8) = *(long *)((long)pvVar4 + 0xb8) + *size;
        uVar13 = crc32(*(undefined8 *)((long)pvVar4 + 0xe8),pvVar12,(int)*size);
        *(undefined8 *)((long)pvVar4 + 0xe8) = uVar13;
        *(undefined4 *)((long)pvVar4 + 0xcc) = 0;
LAB_00132a71:
        uVar20 = 0;
        goto LAB_00132a74;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar4 + 0xb0);
      if (*(long *)((long)pvVar4 + 8) == *(long *)((long)pvVar4 + 0xe8)) {
        *(undefined1 *)((long)pvVar4 + 0xe5) = 1;
        uVar20 = 1;
        goto LAB_00132a74;
      }
      fmt = "File CRC error";
LAB_00132979:
      archive_set_error(&a->archive,0x54,fmt);
      goto LAB_00132988;
    }
    if (((*(int *)((long)pvVar4 + 0xe0) == 0) || (*(char *)((long)pvVar4 + 0x36b) != '\0')) ||
       (uVar15 = *(ulong *)((long)pvVar4 + 0xa8), (long)uVar15 < 1)) {
      if (*(long *)((long)pvVar4 + 0x4ee0) == 0) {
        if (*(long *)((long)a->format->data + 0xa0) < 1) {
LAB_00131e29:
          bVar5 = false;
          uVar20 = 0;
        }
        else {
          pvVar12 = rar_read_ahead(a,1,(ssize_t *)((long)pvVar4 + 0x4ed8));
          *(void **)((long)pvVar4 + 0x4ee0) = pvVar12;
          if (pvVar12 == (void *)0x0) {
            archive_set_error(&a->archive,0x54,"Truncated RAR file data");
            uVar20 = 0xffffffe2;
            bVar5 = true;
          }
          else {
            bVar5 = false;
            uVar20 = 0;
            if (*(int *)((long)pvVar4 + 0x4ed0) == 0) {
              rar_br_fillup(a,(rar_br *)((long)pvVar4 + 0x4ec8));
              goto LAB_00131e29;
            }
          }
        }
        if (bVar5) goto LAB_00132a74;
      }
      if (*(char *)((long)pvVar4 + 0x368) != '\0') {
        uVar6 = parse_codes(a);
        uVar20 = (ulong)uVar6;
        if ((int)uVar6 < -0x14) goto LAB_00132a74;
      }
      if (*(char *)((long)pvVar4 + 0x36b) == '\0') {
        lVar21 = *(long *)((long)pvVar4 + 0xb0);
        lVar14 = (ulong)*(uint *)((long)pvVar4 + 0xe0) + lVar21;
        *(undefined8 *)((long)pvVar4 + 0x360) = 0x7fffffffffffffff;
        pvVar12 = a->format->data;
        br = (rar_br *)((long)pvVar12 + 0x4ec8);
        if (*(long *)((long)pvVar12 + 0x360) < lVar14) {
          lVar14 = *(long *)((long)pvVar12 + 0x360);
        }
        piVar1 = (int *)((long)pvVar12 + 0x344);
        do {
          while( true ) {
            while( true ) {
              if (*(char *)((long)pvVar12 + 0x338) != '\0') {
                uVar6 = *(uint *)((long)pvVar12 + 0x33c);
                if ((long)(*(long *)((long)pvVar12 + 0x330) + (ulong)uVar6) <= lVar14) {
                  if (0 < (int)uVar6) {
                    uVar9 = (uint)*(long *)((long)pvVar12 + 0x330) &
                            *(uint *)((long)pvVar12 + 0x328);
                    uVar16 = uVar9 - *(int *)((long)pvVar12 + 0x340) &
                             *(uint *)((long)pvVar12 + 0x328);
                    uVar11 = uVar6;
                    do {
                      uVar19 = uVar16;
                      if ((int)uVar16 < (int)uVar9) {
                        uVar19 = uVar9;
                      }
                      uVar19 = (*(int *)((long)pvVar12 + 0x328) - uVar19) + 1;
                      if ((int)uVar11 < (int)uVar19) {
                        uVar19 = uVar11;
                      }
                      __dest = (void *)((long)(int)uVar9 + *(long *)((long)pvVar12 + 800));
                      pvVar18 = (void *)(*(long *)((long)pvVar12 + 800) + (long)(int)uVar16);
                      if (((int)(uVar9 + uVar19) < (int)uVar16) ||
                         ((int)(uVar16 + uVar19) < (int)uVar9)) {
                        memcpy(__dest,pvVar18,(long)(int)uVar19);
                      }
                      else if (0 < (int)uVar19) {
                        uVar20 = 0;
                        do {
                          *(undefined1 *)((long)__dest + uVar20) =
                               *(undefined1 *)((long)pvVar18 + uVar20);
                          uVar20 = uVar20 + 1;
                        } while (uVar19 != uVar20);
                      }
                      uVar9 = uVar9 + uVar19 & *(uint *)((long)pvVar12 + 0x328);
                      uVar16 = uVar16 + uVar19 & *(uint *)((long)pvVar12 + 0x328);
                      uVar17 = uVar11 - uVar19;
                      bVar5 = (int)uVar19 <= (int)uVar11;
                      uVar11 = uVar17;
                    } while (uVar17 != 0 && bVar5);
                  }
                  *(long *)((long)pvVar12 + 0x330) =
                       *(long *)((long)pvVar12 + 0x330) + (long)(int)uVar6;
                  *(undefined1 *)((long)pvVar12 + 0x338) = 0;
                }
              }
              if (((*(char *)((long)pvVar12 + 0x36b) != '\0') ||
                  (*(char *)((long)pvVar12 + 0x338) != '\0')) ||
                 (lVar14 <= *(long *)((long)pvVar12 + 0x330))) {
                uVar20 = *(ulong *)((long)pvVar12 + 0x330);
                goto LAB_001325f8;
              }
              iVar7 = read_next_symbol(a,(huffman_code *)((long)pvVar12 + 0x108));
              uVar20 = 0xffffffffffffffe2;
              if (iVar7 < 0) goto LAB_001325f8;
              *(undefined1 *)((long)pvVar12 + 0x338) = 0;
              if (0xff < iVar7) break;
              *(char *)(*(long *)((long)pvVar12 + 800) +
                       (long)(int)(*(uint *)((long)pvVar12 + 0x328) &
                                  *(uint *)((long)pvVar12 + 0x330))) = (char)iVar7;
              *(long *)((long)pvVar12 + 0x330) = *(long *)((long)pvVar12 + 0x330) + 1;
            }
            if (iVar7 == 0x100) break;
            if (iVar7 == 0x102) {
              iVar8 = *(int *)((long)pvVar12 + 0x33c);
              if (iVar8 != 0) {
                iVar22 = *(int *)((long)pvVar12 + 0x340);
                goto LAB_00132599;
              }
            }
            else {
              if (iVar7 == 0x101) {
                archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
                uVar20 = 0xffffffffffffffe7;
                goto LAB_001325f8;
              }
              if (iVar7 < 0x107) {
                iVar22 = piVar1[iVar7 - 0x103];
                uVar6 = read_next_symbol(a,(huffman_code *)((long)pvVar12 + 0x168));
                if (0x1c < uVar6) goto LAB_001328b9;
                iVar8 = (byte)expand_lengthbases[uVar6] + 2;
                if (7 < uVar6) {
                  bVar2 = expand_lengthbits[uVar6];
                  if (((*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar2) &&
                      (iVar10 = rar_br_fillup(a,br), iVar10 == 0)) &&
                     (*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar2)) goto LAB_001328d9;
                  iVar10 = *(int *)((long)pvVar12 + 0x4ed0) - (uint)bVar2;
                  iVar8 = ((uint)(*(ulong *)((long)pvVar12 + 0x4ec8) >> ((byte)iVar10 & 0x3f)) &
                          cache_masks[bVar2]) + iVar8;
                  *(int *)((long)pvVar12 + 0x4ed0) = iVar10;
                }
                uVar20 = (ulong)(iVar7 - 0x103);
                if (0x103 < iVar7) {
                  do {
                    piVar1[uVar20] = *(int *)((long)pvVar12 + uVar20 * 4 + 0x340);
                    bVar5 = 1 < (long)uVar20;
                    uVar20 = uVar20 - 1;
                  } while (bVar5);
                }
                *piVar1 = iVar22;
              }
              else {
                if (0x10e < iVar7) {
                  if (iVar7 < 300) {
                    uVar6 = iVar7 - 0x10f;
                    iVar7 = (byte)expand_lengthbases[uVar6] + 3;
                    if (7 < uVar6) {
                      bVar2 = expand_lengthbits[uVar6];
                      if (((*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar2) &&
                          (iVar8 = rar_br_fillup(a,br), iVar8 == 0)) &&
                         (*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar2)) goto LAB_001328d9;
                      iVar8 = *(int *)((long)pvVar12 + 0x4ed0) - (uint)bVar2;
                      iVar7 = ((uint)(*(ulong *)((long)pvVar12 + 0x4ec8) >> ((byte)iVar8 & 0x3f)) &
                              cache_masks[bVar2]) + iVar7;
                      *(int *)((long)pvVar12 + 0x4ed0) = iVar8;
                    }
                    uVar6 = read_next_symbol(a,(huffman_code *)((long)pvVar12 + 0x128));
                    if (uVar6 < 0x3d) {
                      uVar15 = (ulong)uVar6;
                      iVar22 = *(int *)(expand_offsetbases + uVar15 * 4) + 1;
                      if (3 < uVar6) {
                        bVar2 = expand_offsetbits[uVar15];
                        if ((int)uVar6 < 10) {
                          if (((*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar2) &&
                              (iVar8 = rar_br_fillup(a,br), iVar8 == 0)) &&
                             (*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar2))
                          goto LAB_001328d9;
                          iVar8 = *(int *)((long)pvVar12 + 0x4ed0) - (uint)bVar2;
                          iVar22 = ((uint)(*(ulong *)((long)pvVar12 + 0x4ec8) >>
                                          ((byte)iVar8 & 0x3f)) & cache_masks[bVar2]) + iVar22;
                          *(int *)((long)pvVar12 + 0x4ed0) = iVar8;
                        }
                        else {
                          if (uVar15 - 0xc < 0x30) {
                            iVar8 = bVar2 - 4;
                            if (((*(int *)((long)pvVar12 + 0x4ed0) < iVar8) &&
                                (iVar10 = rar_br_fillup(a,br), iVar10 == 0)) &&
                               (*(int *)((long)pvVar12 + 0x4ed0) < iVar8)) goto LAB_001328d9;
                            iVar8 = *(int *)((long)pvVar12 + 0x4ed0) - iVar8;
                            iVar22 = ((uint)(*(ulong *)((long)pvVar12 + 0x4ec8) >>
                                            ((byte)iVar8 & 0x3f)) & (&UINT_0016b9d0)[bVar2]) * 0x10
                                     + iVar22;
                            *(int *)((long)pvVar12 + 0x4ed0) = iVar8;
                          }
                          if (*(int *)((long)pvVar12 + 0x358) == 0) {
                            iVar8 = read_next_symbol(a,(huffman_code *)((long)pvVar12 + 0x148));
                            if (iVar8 < 0) goto LAB_001325f8;
                            if (iVar8 == 0x10) {
                              *(undefined4 *)((long)pvVar12 + 0x358) = 0xf;
                              goto LAB_0013255c;
                            }
                            *(int *)((long)pvVar12 + 0x354) = iVar8;
                          }
                          else {
                            *(int *)((long)pvVar12 + 0x358) = *(int *)((long)pvVar12 + 0x358) + -1;
LAB_0013255c:
                            iVar8 = *(int *)((long)pvVar12 + 0x354);
                          }
                          iVar22 = iVar22 + iVar8;
                        }
                      }
                      *(undefined4 *)((long)pvVar12 + 0x350) =
                           *(undefined4 *)((long)pvVar12 + 0x34c);
                      *(undefined8 *)((long)pvVar12 + 0x348) = *(undefined8 *)piVar1;
                      iVar8 = iVar7 + (uint)(0x3ffff < iVar22) + (uint)(0x1fff < iVar22);
                      *piVar1 = iVar22;
                      goto LAB_00132599;
                    }
                  }
LAB_001328b9:
                  archive_set_error(&a->archive,0x54,"Bad RAR file data");
                  goto LAB_001325f8;
                }
                bVar2 = *(byte *)((long)&expand_shortbases + (ulong)(iVar7 - 0x107));
                bVar3 = *(byte *)((long)&expand_shortbits + (ulong)(iVar7 - 0x107));
                if (((*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar3) &&
                    (iVar7 = rar_br_fillup(a,br), iVar7 == 0)) &&
                   (*(int *)((long)pvVar12 + 0x4ed0) < (int)(uint)bVar3)) goto LAB_001328d9;
                iVar7 = *(int *)((long)pvVar12 + 0x4ed0) - (uint)bVar3;
                *(int *)((long)pvVar12 + 0x4ed0) = iVar7;
                *(undefined4 *)((long)pvVar12 + 0x350) = *(undefined4 *)((long)pvVar12 + 0x34c);
                *(undefined8 *)((long)pvVar12 + 0x348) = *(undefined8 *)piVar1;
                iVar22 = ((uint)(*(ulong *)((long)pvVar12 + 0x4ec8) >> ((byte)iVar7 & 0x3f)) &
                         cache_masks[bVar3]) + bVar2 + 1;
                *(int *)((long)pvVar12 + 0x344) = iVar22;
                iVar8 = 2;
              }
LAB_00132599:
              *(int *)((long)pvVar12 + 0x340) = iVar22;
              *(int *)((long)pvVar12 + 0x33c) = iVar8;
              *(undefined1 *)((long)pvVar12 + 0x338) = 1;
            }
          }
          if (((*(int *)((long)pvVar12 + 0x4ed0) < 1) && (iVar7 = rar_br_fillup(a,br), iVar7 == 0))
             && (*(int *)((long)pvVar12 + 0x4ed0) < 1)) {
LAB_001328d9:
            archive_set_error(&a->archive,0x54,"Truncated RAR file data");
            *(undefined1 *)((long)pvVar12 + 200) = 0;
            break;
          }
          iVar7 = *(int *)((long)pvVar12 + 0x4ed0);
          uVar6 = iVar7 - 1;
          *(uint *)((long)pvVar12 + 0x4ed0) = uVar6;
          if ((*(ulong *)((long)pvVar12 + 0x4ec8) >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            *(undefined1 *)((long)pvVar12 + 0xe4) = 1;
            if (((iVar7 < 2) && (iVar7 = rar_br_fillup(a,br), iVar7 == 0)) &&
               (*(int *)((long)pvVar12 + 0x4ed0) < 1)) goto LAB_001328d9;
            uVar6 = *(int *)((long)pvVar12 + 0x4ed0) - 1;
            *(bool *)((long)pvVar12 + 0x368) =
                 (*(ulong *)((long)pvVar12 + 0x4ec8) >> ((ulong)uVar6 & 0x3f) & 1) != 0;
            *(uint *)((long)pvVar12 + 0x4ed0) = uVar6;
            uVar20 = *(ulong *)((long)pvVar12 + 0x330);
            break;
          }
          iVar7 = parse_codes(a);
        } while (iVar7 == 0);
LAB_001325f8:
        if ((long)uVar20 < 0) goto LAB_00132a74;
        lVar21 = uVar20 - lVar21;
        *(long *)((long)pvVar4 + 0xa8) = lVar21;
        if (lVar21 == 0) {
          fmt = "Internal error extracting RAR file";
          goto LAB_00132979;
        }
      }
      else {
        iVar7 = Ppmd7_DecodeSymbol(p,rc);
        if (iVar7 < 0) {
LAB_00132972:
          fmt = "Invalid symbol";
          goto LAB_00132979;
        }
        if (iVar7 == *(int *)((long)pvVar4 + 0x36c)) {
          iVar8 = Ppmd7_DecodeSymbol(p,rc);
          if (iVar8 < 0) goto LAB_00132972;
          switch(iVar8) {
          case 0:
            goto switchD_00131ecf_caseD_0;
          default:
            goto switchD_00131ecf_caseD_1;
          case 2:
            *(undefined1 *)((long)pvVar4 + 0x36a) = 1;
            goto LAB_0013281b;
          case 3:
            archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
            uVar20 = 0xffffffe7;
            goto LAB_00132a74;
          case 4:
            uVar6 = 0;
            iVar7 = 0x10;
            do {
              iVar8 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar8 < 0) goto LAB_00132972;
              uVar6 = uVar6 | iVar8 << ((byte)iVar7 & 0x1f);
              iVar7 = iVar7 + -8;
            } while (iVar7 != -8);
            iVar7 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar7 < 0) goto LAB_00132972;
            uVar16 = iVar7 + 0x20;
            uVar11 = *(uint *)((long)pvVar4 + 0x330) & *(uint *)((long)pvVar4 + 0x328);
            uVar9 = (uVar11 - uVar6) - 2 & *(uint *)((long)pvVar4 + 0x328);
            uVar6 = uVar16;
            do {
              uVar19 = uVar9;
              if ((int)uVar9 < (int)uVar11) {
                uVar19 = uVar11;
              }
              uVar19 = (*(int *)((long)pvVar4 + 0x328) - uVar19) + 1;
              if ((int)uVar6 < (int)uVar19) {
                uVar19 = uVar6;
              }
              pvVar18 = (void *)((long)(int)uVar11 + *(long *)((long)pvVar4 + 800));
              pvVar12 = (void *)(*(long *)((long)pvVar4 + 800) + (long)(int)uVar9);
              if (((int)(uVar19 + uVar11) < (int)uVar9) || ((int)(uVar19 + uVar9) < (int)uVar11)) {
                memcpy(pvVar18,pvVar12,(long)(int)uVar19);
              }
              else if (0 < (int)uVar19) {
                uVar20 = 0;
                do {
                  *(undefined1 *)((long)pvVar18 + uVar20) = *(undefined1 *)((long)pvVar12 + uVar20);
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
              uVar11 = uVar19 + uVar11 & *(uint *)((long)pvVar4 + 0x328);
              uVar9 = uVar19 + uVar9 & *(uint *)((long)pvVar4 + 0x328);
              uVar17 = uVar6 - uVar19;
              bVar5 = (int)uVar19 <= (int)uVar6;
              uVar6 = uVar17;
            } while (uVar17 != 0 && bVar5);
            break;
          case 5:
            iVar7 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar7 < 0) goto LAB_00132972;
            uVar16 = iVar7 + 4;
            uVar11 = *(uint *)((long)pvVar4 + 0x330) & *(uint *)((long)pvVar4 + 0x328);
            uVar9 = uVar11 - 1 & *(uint *)((long)pvVar4 + 0x328);
            uVar6 = uVar16;
            do {
              uVar19 = uVar9;
              if ((int)uVar9 < (int)uVar11) {
                uVar19 = uVar11;
              }
              uVar19 = (*(int *)((long)pvVar4 + 0x328) - uVar19) + 1;
              if ((int)uVar6 < (int)uVar19) {
                uVar19 = uVar6;
              }
              pvVar18 = (void *)((long)(int)uVar11 + *(long *)((long)pvVar4 + 800));
              pvVar12 = (void *)(*(long *)((long)pvVar4 + 800) + (long)(int)uVar9);
              if (((int)(uVar19 + uVar11) < (int)uVar9) || ((int)(uVar19 + uVar9) < (int)uVar11)) {
                memcpy(pvVar18,pvVar12,(long)(int)uVar19);
              }
              else if (0 < (int)uVar19) {
                uVar20 = 0;
                do {
                  *(undefined1 *)((long)pvVar18 + uVar20) = *(undefined1 *)((long)pvVar12 + uVar20);
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
              uVar11 = uVar19 + uVar11 & *(uint *)((long)pvVar4 + 0x328);
              uVar9 = uVar19 + uVar9 & *(uint *)((long)pvVar4 + 0x328);
              uVar17 = uVar6 - uVar19;
              bVar5 = (int)uVar19 <= (int)uVar6;
              uVar6 = uVar17;
            } while (uVar17 != 0 && bVar5);
          }
          *(long *)((long)pvVar4 + 0x330) = *(long *)((long)pvVar4 + 0x330) + (ulong)uVar16;
        }
        else {
switchD_00131ecf_caseD_1:
          *(char *)(*(long *)((long)pvVar4 + 800) +
                   (long)(int)(*(uint *)((long)pvVar4 + 0x328) & *(uint *)((long)pvVar4 + 0x330))) =
               (char)iVar7;
          *(long *)((long)pvVar4 + 0x330) = *(long *)((long)pvVar4 + 0x330) + 1;
          uVar16 = 1;
        }
        *(long *)((long)pvVar4 + 0xa8) = *(long *)((long)pvVar4 + 0xa8) + (ulong)uVar16;
      }
      uVar20 = (ulong)(uint)(*(int *)((long)pvVar4 + 0xd0) - *(int *)((long)pvVar4 + 0xcc));
      if ((long)*(ulong *)((long)pvVar4 + 0xa8) < (long)uVar20) {
        uVar20 = *(ulong *)((long)pvVar4 + 0xa8);
      }
      uVar6 = copy_from_lzss_window(a,buff,*(int64_t *)((long)pvVar4 + 0xb0),(int)uVar20);
      if (uVar6 != 0) goto LAB_001329de;
      *(long *)((long)pvVar4 + 0xb0) = *(long *)((long)pvVar4 + 0xb0) + uVar20;
      *(long *)((long)pvVar4 + 0xa8) = *(long *)((long)pvVar4 + 0xa8) - uVar20;
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)(uint)(*(int *)((long)pvVar4 + 0xd0) - *(int *)((long)pvVar4 + 0xcc));
      if ((long)uVar15 < (long)uVar20) {
        uVar20 = uVar15;
      }
      uVar6 = copy_from_lzss_window(a,buff,*(int64_t *)((long)pvVar4 + 0xb0),(int)uVar20);
      if (uVar6 != 0) {
LAB_001329de:
        uVar20 = (ulong)uVar6;
        goto LAB_00132a74;
      }
      *(long *)((long)pvVar4 + 0xb0) = *(long *)((long)pvVar4 + 0xb0) + uVar20;
      *(long *)((long)pvVar4 + 0xa8) = *(long *)((long)pvVar4 + 0xa8) - uVar20;
      pvVar12 = *buff;
      uVar20 = 0;
      if (pvVar12 != (void *)0x0) {
        *(undefined4 *)((long)pvVar4 + 0xcc) = 0;
        *size = (ulong)*(uint *)((long)pvVar4 + 0xd0);
        *offset = *(int64_t *)((long)pvVar4 + 0xb8);
        *(long *)((long)pvVar4 + 0xb8) = *(long *)((long)pvVar4 + 0xb8) + *size;
        uVar13 = crc32(*(undefined8 *)((long)pvVar4 + 0xe8),pvVar12,(int)*size);
        *(undefined8 *)((long)pvVar4 + 0xe8) = uVar13;
        goto LAB_00132a71;
      }
    }
LAB_0013281b:
    pvVar12 = *buff;
    if (pvVar12 != (void *)0x0) {
      *(undefined4 *)((long)pvVar4 + 0xcc) = 0;
      *size = (ulong)*(uint *)((long)pvVar4 + 0xd0);
      *offset = *(int64_t *)((long)pvVar4 + 0xb8);
      *(long *)((long)pvVar4 + 0xb8) = *(long *)((long)pvVar4 + 0xb8) + *size;
      uVar13 = crc32(*(undefined8 *)((long)pvVar4 + 0xe8),pvVar12,(int)*size);
      *(undefined8 *)((long)pvVar4 + 0xe8) = uVar13;
LAB_00132a74:
      return (int)uVar20;
    }
  } while( true );
switchD_00131ecf_caseD_0:
  *(undefined1 *)((long)pvVar4 + 0x368) = 1;
  goto LAB_00131ce0;
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
               int64_t *offset)
{
  struct rar *rar;
  int64_t start, end, actualend;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);
    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;
      rar->filterstart = INT64_MAX;

      if ((actualend = expand(a, end)) < 0)
        return ((int)actualend);

      rar->bytes_uncopied = actualend - start;
      if (rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}